

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_change_extpri_stream_priority
              (nghttp2_session *session,int32_t stream_id,nghttp2_extpri *extpri_in,
              int ignore_client_signal)

{
  uint8_t u8extpri;
  nghttp2_extpri stream_00;
  nghttp2_extpri local_40;
  nghttp2_extpri extpri;
  nghttp2_stream *stream;
  int ignore_client_signal_local;
  nghttp2_extpri *extpri_in_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  local_40 = *extpri_in;
  if (session->server == '\0') {
    session_local._4_4_ = -0x207;
  }
  else if (session->pending_no_rfc7540_priorities == '\x01') {
    if (stream_id == 0) {
      session_local._4_4_ = -0x1f5;
    }
    else {
      stream_00 = (nghttp2_extpri)nghttp2_session_get_stream_raw(session,stream_id);
      if (stream_00 == (nghttp2_extpri)0x0) {
        session_local._4_4_ = -0x1f5;
      }
      else {
        if (7 < local_40.urgency) {
          local_40.urgency = 7;
        }
        if (ignore_client_signal != 0) {
          *(byte *)((long)stream_00 + 0xd8) = *(uint8_t *)((long)stream_00 + 0xd8) | 0x20;
        }
        extpri = stream_00;
        u8extpri = nghttp2_extpri_to_uint8(&local_40);
        session_local._4_4_ =
             session_update_stream_priority(session,(nghttp2_stream *)stream_00,u8extpri);
      }
    }
  }
  else {
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_change_extpri_stream_priority(
    nghttp2_session *session, int32_t stream_id,
    const nghttp2_extpri *extpri_in, int ignore_client_signal) {
  nghttp2_stream *stream;
  nghttp2_extpri extpri = *extpri_in;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (session->pending_no_rfc7540_priorities != 1) {
    return 0;
  }

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (extpri.urgency > NGHTTP2_EXTPRI_URGENCY_LOW) {
    extpri.urgency = NGHTTP2_EXTPRI_URGENCY_LOW;
  }

  if (ignore_client_signal) {
    stream->flags |= NGHTTP2_STREAM_FLAG_IGNORE_CLIENT_PRIORITIES;
  }

  return session_update_stream_priority(session, stream,
                                        nghttp2_extpri_to_uint8(&extpri));
}